

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page.c
# Opt level: O0

void mi_page_extend_free(mi_heap_t *heap,mi_page_t *page,mi_tld_t *tld)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  mi_stats_t *in_RDX;
  mi_page_t *in_RSI;
  size_t in_RDI;
  mi_page_t *unaff_retaddr;
  size_t max_extend;
  size_t extend;
  size_t bsize;
  ulong local_38;
  ulong local_30;
  ulong local_28;
  
  if ((in_RSI->free == (mi_block_t *)0x0) && (in_RSI->capacity < in_RSI->reserved)) {
    sVar2 = mi_page_block_size(in_RSI);
    local_28 = (ulong)(int)((uint)in_RSI->reserved - (uint)in_RSI->capacity);
    if (sVar2 < 0x1000) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = sVar2;
      local_38 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1000)) / auVar1,0);
    }
    else {
      local_38 = 4;
    }
    local_30 = local_38;
    if (local_38 < 4) {
      local_30 = 4;
    }
    if (local_30 < local_28) {
      local_28 = local_30;
    }
    mi_page_free_list_extend(unaff_retaddr,in_RDI,(size_t)in_RSI,in_RDX);
    in_RSI->capacity = in_RSI->capacity + (short)local_28;
  }
  return;
}

Assistant:

static void mi_page_extend_free(mi_heap_t* heap, mi_page_t* page, mi_tld_t* tld) {
  MI_UNUSED(tld);
  mi_assert_expensive(mi_page_is_valid_init(page));
  #if (MI_SECURE<=2)
  mi_assert(page->free == NULL);
  mi_assert(page->local_free == NULL);
  if (page->free != NULL) return;
  #endif
  if (page->capacity >= page->reserved) return;

  mi_stat_counter_increase(tld->stats.pages_extended, 1);

  // calculate the extend count
  const size_t bsize = mi_page_block_size(page);
  size_t extend = page->reserved - page->capacity;
  mi_assert_internal(extend > 0);

  size_t max_extend = (bsize >= MI_MAX_EXTEND_SIZE ? MI_MIN_EXTEND : MI_MAX_EXTEND_SIZE/bsize);
  if (max_extend < MI_MIN_EXTEND) { max_extend = MI_MIN_EXTEND; }
  mi_assert_internal(max_extend > 0);

  if (extend > max_extend) {
    // ensure we don't touch memory beyond the page to reduce page commit.
    // the `lean` benchmark tests this. Going from 1 to 8 increases rss by 50%.
    extend = max_extend;
  }

  mi_assert_internal(extend > 0 && extend + page->capacity <= page->reserved);
  mi_assert_internal(extend < (1UL<<16));

  // and append the extend the free list
  if (extend < MI_MIN_SLICES || MI_SECURE==0) { //!mi_option_is_enabled(mi_option_secure)) {
    mi_page_free_list_extend(page, bsize, extend, &tld->stats );
  }
  else {
    mi_page_free_list_extend_secure(heap, page, bsize, extend, &tld->stats);
  }
  // enable the new free list
  page->capacity += (uint16_t)extend;
  mi_stat_increase(tld->stats.page_committed, extend * bsize);
  mi_assert_expensive(mi_page_is_valid_init(page));
}